

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CmdLineParser.cpp
# Opt level: O1

void anon_unknown.dwarf_9d1c7::run(void)

{
  int iVar1;
  MyClass2 *pMVar2;
  EVP_PKEY_CTX *pEVar3;
  RefCount *parent;
  long extraout_RDX;
  long lVar4;
  long extraout_RDX_00;
  long lVar5;
  bool bVar6;
  WeakPtr<(anonymous_namespace)::IMyInterface> w_1;
  Ptr<(anonymous_namespace)::IMyInterface> p3;
  Ptr<(anonymous_namespace)::MyClass2> p;
  WeakPtr<(anonymous_namespace)::MyClass2> w;
  Ptr<(anonymous_namespace)::IMyInterface> local_98;
  Ptr<(anonymous_namespace)::MyClass2> local_88;
  Ptr<(anonymous_namespace)::MyClass2> local_78;
  WeakPtr<(anonymous_namespace)::MyClass2> local_68;
  Ptr<(anonymous_namespace)::IMyInterface> local_58;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  run_Buf();
  pEVar3 = (EVP_PKEY_CTX *)operator_new(0x18,(nothrow_t *)&std::nothrow);
  *(undefined8 *)(pEVar3 + 8) = 0;
  *(undefined4 *)(pEVar3 + 0x10) = 0;
  *(undefined4 *)(pEVar3 + 0x14) = 1;
  *(undefined ***)pEVar3 = &PTR__MyClass2_0014c4d8;
  puts("MyClass2::MyClass2 ()");
  *(code **)(pEVar3 + 8) = axl::mem::deallocate;
  local_78.m_p = (MyClass2 *)0x0;
  local_78.m_refCount = (RefCount *)0x0;
  axl::rc::Ptr<(anonymous_namespace)::MyClass2>::copy(&local_78,pEVar3,pEVar3);
  local_68.m_refCount = (RefCount *)0x0;
  if (local_78.m_refCount != (RefCount *)0x0) {
    LOCK();
    (local_78.m_refCount)->m_weakRefCount = (local_78.m_refCount)->m_weakRefCount + 1;
    UNLOCK();
    local_68.m_refCount = local_78.m_refCount;
  }
  local_68.m_p = local_78.m_p;
  axl::rc::Ptr<(anonymous_namespace)::MyClass2>::clear(&local_78);
  local_88.m_p = (MyClass2 *)0x0;
  local_88.m_refCount = (RefCount *)0x0;
  lVar4 = extraout_RDX;
  if (local_68.m_refCount != (RefCount *)0x0) {
    do {
      iVar1 = (local_68.m_refCount)->m_refCount;
      if ((long)iVar1 == 0) {
        lVar4 = 0;
        bVar6 = false;
      }
      else {
        lVar5 = (long)iVar1 + 1;
        LOCK();
        bVar6 = iVar1 == (local_68.m_refCount)->m_refCount;
        if (bVar6) {
          (local_68.m_refCount)->m_refCount = (int32_t)lVar5;
        }
        UNLOCK();
        if (bVar6) {
          lVar4 = lVar5;
        }
        bVar6 = !bVar6;
      }
    } while (bVar6);
    if (lVar4 != 0) {
      uStack_3c = local_68.m_refCount._4_4_;
      uStack_40 = local_68.m_refCount._0_4_;
      uStack_44 = local_68.m_p._4_4_;
      local_48 = local_68.m_p._0_4_;
      local_88.m_p = local_68.m_p;
      local_88.m_refCount = local_68.m_refCount;
    }
  }
  axl::rc::Ptr<(anonymous_namespace)::MyClass2>::copy
            (&local_78,(EVP_PKEY_CTX *)local_88.m_p,(EVP_PKEY_CTX *)local_88.m_refCount);
  axl::rc::Ptr<(anonymous_namespace)::MyClass2>::clear(&local_88);
  axl::rc::WeakPtr<(anonymous_namespace)::MyClass2>::~WeakPtr(&local_68);
  axl::rc::Ptr<(anonymous_namespace)::MyClass2>::clear(&local_78);
  local_78.m_p = (MyClass2 *)0x0;
  local_78.m_refCount = (RefCount *)0x0;
  local_68.m_p = (MyClass2 *)0x0;
  local_68.m_refCount = (RefCount *)0x0;
  local_88.m_p = (MyClass2 *)0x0;
  local_88.m_refCount = (RefCount *)0x0;
  parent = (RefCount *)operator_new(0x188,(nothrow_t *)&std::nothrow);
  parent->m_freeFunc = (FreeFunc *)0x0;
  parent->m_refCount = 0;
  parent->m_weakRefCount = 1;
  parent->_vptr_RefCount = (_func_int **)&PTR__MySuperContainer_0014c510;
  parent[1]._vptr_RefCount = (_func_int **)&PTR_getChild_0014c548;
  axl::rc::Child<(anonymous_namespace)::MyContainer,_0UL>::Child
            ((Child<(anonymous_namespace)::MyContainer,_0UL> *)&parent[1].m_freeFunc,parent);
  axl::rc::Child<(anonymous_namespace)::MyContainer,_0UL>::Child
            ((Child<(anonymous_namespace)::MyContainer,_0UL> *)(parent + 8),parent);
  parent[0xe].m_refCount = 0x168;
  parent[0xe].m_weakRefCount = 0;
  parent[0xf]._vptr_RefCount = (_func_int **)&PTR__RefCount_0014bff0;
  parent[0xf].m_freeFunc = (FreeFunc *)0x0;
  parent[0xf].m_refCount = 0;
  parent[0xf].m_weakRefCount = 1;
  parent[0x10]._vptr_RefCount = (_func_int **)&PTR_getChild_0014c710;
  puts("MyClass4::MyClass4 ()");
  parent[0xf]._vptr_RefCount = (_func_int **)&PTR__Box_0014c678;
  parent[0x10]._vptr_RefCount = (_func_int **)&PTR_getChild_0014c698;
  parent[0xf].m_freeFunc =
       axl::rc::Child<axl::rc::Box<(anonymous_namespace)::MyClass4>,_0UL>::weakReleaseParent;
  LOCK();
  parent->m_weakRefCount = parent->m_weakRefCount + 1;
  UNLOCK();
  LOCK();
  parent[0xf].m_refCount = parent[0xf].m_refCount + 1;
  UNLOCK();
  puts("MySuperContainer::MySuperContainer ()");
  parent->m_freeFunc = axl::mem::deallocate;
  local_98.m_p = (IMyInterface *)0x0;
  local_98.m_refCount = (RefCount *)0x0;
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::copy
            (&local_98,(EVP_PKEY_CTX *)(parent + 1),(EVP_PKEY_CTX *)parent);
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::copy
            ((Ptr<(anonymous_namespace)::IMyInterface> *)&local_78,(EVP_PKEY_CTX *)local_98.m_p,
             (EVP_PKEY_CTX *)local_98.m_refCount);
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::clear(&local_98);
  pMVar2 = local_78.m_p;
  (*((local_78.m_p)->super_RefCount)._vptr_RefCount[1])(local_78.m_p);
  (*(pMVar2->super_RefCount)._vptr_RefCount[2])(pMVar2);
  (**(pMVar2->super_RefCount)._vptr_RefCount)(&local_98,pMVar2,1);
  (**(code **)(*(long *)local_98.m_p + 8))();
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::clear(&local_98);
  (**(pMVar2->super_RefCount)._vptr_RefCount)(&local_98,pMVar2,1);
  (**(code **)(*(long *)local_98.m_p + 0x10))();
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::clear(&local_98);
  (**(pMVar2->super_RefCount)._vptr_RefCount)(&local_98,pMVar2,2);
  (**(code **)(*(long *)local_98.m_p + 8))();
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::clear(&local_98);
  (**(pMVar2->super_RefCount)._vptr_RefCount)(&local_98,pMVar2,2);
  (**(code **)(*(long *)local_98.m_p + 0x10))();
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::clear(&local_98);
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::clear
            ((Ptr<(anonymous_namespace)::IMyInterface> *)&local_78);
  pEVar3 = (EVP_PKEY_CTX *)operator_new(0x20,(nothrow_t *)&std::nothrow);
  *(undefined ***)pEVar3 = &PTR__RefCount_0014bff0;
  *(undefined8 *)(pEVar3 + 8) = 0;
  *(undefined4 *)(pEVar3 + 0x10) = 0;
  *(undefined4 *)(pEVar3 + 0x14) = 1;
  *(undefined ***)(pEVar3 + 0x18) = &PTR_getChild_0014c710;
  puts("MyClass4::MyClass4 ()");
  *(undefined ***)pEVar3 = &PTR__Box_0014c678;
  *(undefined ***)(pEVar3 + 0x18) = &PTR_getChild_0014c698;
  *(code **)(pEVar3 + 8) = axl::mem::deallocate;
  local_98.m_p = (IMyInterface *)0x0;
  local_98.m_refCount = (RefCount *)0x0;
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::copy(&local_98,pEVar3 + 0x18,pEVar3);
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::copy
            ((Ptr<(anonymous_namespace)::IMyInterface> *)&local_88,(EVP_PKEY_CTX *)local_98.m_p,
             (EVP_PKEY_CTX *)local_98.m_refCount);
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::clear(&local_98);
  local_98.m_refCount = (RefCount *)0x0;
  if (local_88.m_refCount != (RefCount *)0x0) {
    LOCK();
    (local_88.m_refCount)->m_weakRefCount = (local_88.m_refCount)->m_weakRefCount + 1;
    UNLOCK();
    local_98.m_refCount = local_88.m_refCount;
  }
  local_98.m_p = (IMyInterface *)local_88.m_p;
  (**(code **)(*(long *)local_88.m_p + 0x10))();
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::clear
            ((Ptr<(anonymous_namespace)::IMyInterface> *)&local_88);
  local_58.m_p = (IMyInterface *)0x0;
  local_58.m_refCount = (RefCount *)0x0;
  lVar4 = extraout_RDX_00;
  if (local_98.m_refCount != (RefCount *)0x0) {
    do {
      iVar1 = (local_98.m_refCount)->m_refCount;
      if ((long)iVar1 == 0) {
        lVar4 = 0;
        bVar6 = false;
      }
      else {
        lVar5 = (long)iVar1 + 1;
        LOCK();
        bVar6 = iVar1 == (local_98.m_refCount)->m_refCount;
        if (bVar6) {
          (local_98.m_refCount)->m_refCount = (int32_t)lVar5;
        }
        UNLOCK();
        if (bVar6) {
          lVar4 = lVar5;
        }
        bVar6 = !bVar6;
      }
    } while (bVar6);
    if (lVar4 != 0) {
      uStack_3c = local_98.m_refCount._4_4_;
      uStack_40 = local_98.m_refCount._0_4_;
      uStack_44 = local_98.m_p._4_4_;
      local_48 = local_98.m_p._0_4_;
      local_58.m_p = local_98.m_p;
      local_58.m_refCount = local_98.m_refCount;
    }
  }
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::copy
            ((Ptr<(anonymous_namespace)::IMyInterface> *)&local_78,(EVP_PKEY_CTX *)local_58.m_p,
             (EVP_PKEY_CTX *)local_58.m_refCount);
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::clear(&local_58);
  axl::rc::WeakPtr<(anonymous_namespace)::IMyInterface>::~WeakPtr
            ((WeakPtr<(anonymous_namespace)::IMyInterface> *)&local_98);
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::clear
            ((Ptr<(anonymous_namespace)::IMyInterface> *)&local_88);
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::clear
            ((Ptr<(anonymous_namespace)::IMyInterface> *)&local_68);
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::clear
            ((Ptr<(anonymous_namespace)::IMyInterface> *)&local_78);
  return;
}

Assistant:

void
run() {
	const char* cmdLine[] = {
		"--help",
		"--session-provider=serial",
		"--session-file=my_serial_ssn.njssn",
		"--log-file=my_serial_ssn.njlog",
		"-fserial_ssn.njssn",
		"-l=serial_ssn.njlog",
	};

	MyParser parser;
	parser.parse((int)countof(cmdLine), cmdLine);

}